

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::GenEnumReader
          (DartGenerator *this,EnumDef *enum_def,string *enum_type,string *code)

{
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::operator+(&local_68,"class _",enum_type);
  std::operator+(&local_88,&local_68,"Reader extends ");
  std::operator+(&local_a8,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_c8,&local_a8,".Reader<");
  std::operator+(&local_e8,&local_c8,enum_type);
  std::operator+(&bStack_108,&local_e8,"> {\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_e8,"  const _",enum_type);
  std::operator+(&bStack_108,&local_e8,"Reader();\n\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::append((char *)code);
  EnumSize_abi_cxx11_(&local_c8,(DartGenerator *)&enum_def->underlying_type,type);
  std::operator+(&local_e8,"  int get size => ",&local_c8);
  std::operator+(&bStack_108,&local_e8,";\n\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::append((char *)code);
  std::operator+(&local_a8,"  ",enum_type);
  std::operator+(&local_c8,&local_a8," read(");
  std::operator+(&local_e8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&bStack_108,&local_e8,".BufferContext bc, int offset) =>\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::operator+(&local_68,"      ",enum_type);
  std::operator+(&local_88,&local_68,".fromValue(const ");
  std::operator+(&local_a8,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_c8,&local_a8,".");
  GenType_abi_cxx11_(&local_48,this,&enum_def->underlying_type);
  std::operator+(&local_e8,&local_c8,&local_48);
  std::operator+(&bStack_108,&local_e8,"Reader().read(bc, offset));\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::append((char *)code);
  return;
}

Assistant:

void GenEnumReader(EnumDef &enum_def, const std::string &enum_type,
                     std::string &code) {
    code += "class _" + enum_type + "Reader extends " + _kFb + ".Reader<" +
            enum_type + "> {\n";
    code += "  const _" + enum_type + "Reader();\n\n";
    code += "  @override\n";
    code += "  int get size => " + EnumSize(enum_def.underlying_type) + ";\n\n";
    code += "  @override\n";
    code += "  " + enum_type + " read(" + _kFb +
            ".BufferContext bc, int offset) =>\n";
    code += "      " + enum_type + ".fromValue(const " + _kFb + "." +
            GenType(enum_def.underlying_type) + "Reader().read(bc, offset));\n";
    code += "}\n\n";
  }